

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string_value_scanner.cpp
# Opt level: O3

bool __thiscall
duckdb::StringValueScanner::IsRowValid(StringValueScanner *this,CSVIterator *current_iterator)

{
  idx_t iVar1;
  char *pcVar2;
  char *pcVar3;
  undefined4 uVar4;
  undefined4 uVar5;
  int iVar6;
  CSVBufferHandle *pCVar7;
  StringValueScanner *this_00;
  pointer pSVar8;
  undefined4 extraout_var;
  char *pcVar10;
  bool bVar11;
  undefined1 local_41;
  _Head_base<0UL,_duckdb::StringValueScanner_*,_false> local_40;
  shared_ptr<duckdb::CSVErrorHandler,_true> local_38;
  CSVErrorHandler *local_28;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_20;
  long lVar9;
  
  iVar1 = (this->super_BaseScanner).iterator.pos.buffer_pos;
  pCVar7 = shared_ptr<duckdb::CSVBufferHandle,_true>::operator->
                     (&(this->super_BaseScanner).cur_buffer_handle);
  if (iVar1 == pCVar7->actual_size) {
    return false;
  }
  local_28 = (CSVErrorHandler *)0x0;
  ::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<duckdb::CSVErrorHandler,std::allocator<duckdb::CSVErrorHandler>>
            (&local_20,&local_28,(allocator<duckdb::CSVErrorHandler> *)&local_41);
  local_38.internal.super___shared_ptr<duckdb::CSVErrorHandler,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       local_28;
  local_38.internal.super___shared_ptr<duckdb::CSVErrorHandler,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = local_20._M_pi;
  if (local_20._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      (local_20._M_pi)->_M_use_count = (local_20._M_pi)->_M_use_count + 1;
      UNLOCK();
      if (local_20._M_pi == (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) goto LAB_00d067af;
    }
    else {
      (local_20._M_pi)->_M_use_count = (local_20._M_pi)->_M_use_count + 1;
    }
    ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_20._M_pi);
  }
LAB_00d067af:
  this_00 = (StringValueScanner *)operator_new(0x4c8);
  StringValueScanner(this_00,0xffffffffffffffff,&(this->super_BaseScanner).buffer_manager,
                     &this->state_machine_strict,&local_38,&(this->super_BaseScanner).csv_file_scan,
                     false,current_iterator,1);
  local_40._M_head_impl = this_00;
  if (local_38.internal.super___shared_ptr<duckdb::CSVErrorHandler,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_38.internal.
               super___shared_ptr<duckdb::CSVErrorHandler,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
               _M_pi);
  }
  pSVar8 = unique_ptr<duckdb::StringValueScanner,_std::default_delete<duckdb::StringValueScanner>,_true>
           ::operator->((unique_ptr<duckdb::StringValueScanner,_std::default_delete<duckdb::StringValueScanner>,_true>
                         *)&local_40);
  iVar6 = (*(pSVar8->super_BaseScanner)._vptr_BaseScanner[2])(pSVar8);
  lVar9 = CONCAT44(extraout_var,iVar6);
  pSVar8 = unique_ptr<duckdb::StringValueScanner,_std::default_delete<duckdb::StringValueScanner>,_true>
           ::operator->((unique_ptr<duckdb::StringValueScanner,_std::default_delete<duckdb::StringValueScanner>,_true>
                         *)&local_40);
  uVar4 = *(undefined4 *)((long)&(pSVar8->super_BaseScanner).iterator.pos.buffer_idx + 4);
  iVar1 = (pSVar8->super_BaseScanner).iterator.pos.buffer_pos;
  uVar5 = *(undefined4 *)((long)&(pSVar8->super_BaseScanner).iterator.pos.buffer_pos + 4);
  *(int *)&(current_iterator->pos).buffer_idx =
       (int)(pSVar8->super_BaseScanner).iterator.pos.buffer_idx;
  *(undefined4 *)((long)&(current_iterator->pos).buffer_idx + 4) = uVar4;
  *(int *)&(current_iterator->pos).buffer_pos = (int)iVar1;
  *(undefined4 *)((long)&(current_iterator->pos).buffer_pos + 4) = uVar5;
  pcVar2 = *(char **)(lVar9 + 0x220);
  pcVar3 = *(char **)(lVar9 + 0x228);
  if (pcVar2 == pcVar3) {
    bVar11 = true;
LAB_00d06866:
    if (*(long *)(lVar9 + 0xf0) != 1) {
      bVar11 = (bool)(*(byte *)(lVar9 + 0x398) & bVar11);
    }
    if (bVar11 != false) {
      bVar11 = *(long *)(lVar9 + 0x358) == 0;
      goto LAB_00d0688c;
    }
  }
  else if ((long)pcVar3 - (long)pcVar2 == 0x58) {
    do {
      pcVar10 = pcVar2 + 0x58;
      bVar11 = *pcVar2 == '\x06';
      if (bVar11) break;
      pcVar2 = pcVar10;
    } while (pcVar10 != pcVar3);
    goto LAB_00d06866;
  }
  bVar11 = false;
LAB_00d0688c:
  if (local_40._M_head_impl != (StringValueScanner *)0x0) {
    (*((local_40._M_head_impl)->super_BaseScanner)._vptr_BaseScanner[1])();
  }
  return bVar11;
}

Assistant:

bool StringValueScanner::IsRowValid(CSVIterator &current_iterator) const {
	if (iterator.pos.buffer_pos == cur_buffer_handle->actual_size) {
		return false;
	}
	constexpr idx_t result_size = 1;
	auto scan_finder = make_uniq<StringValueScanner>(StringValueScanner::LINE_FINDER_ID, buffer_manager,
	                                                 state_machine_strict, make_shared_ptr<CSVErrorHandler>(),
	                                                 csv_file_scan, false, current_iterator, result_size);
	auto &tuples = scan_finder->ParseChunk();
	current_iterator.pos = scan_finder->GetIteratorPosition();
	bool has_error = false;
	if (tuples.current_errors.HasError()) {
		if (tuples.current_errors.Size() != 1 || !tuples.current_errors.HasErrorType(MAXIMUM_LINE_SIZE)) {
			// We ignore maximum line size errors
			has_error = true;
		}
	}
	return (tuples.number_of_rows == 1 || tuples.first_line_is_comment) && !has_error && tuples.borked_rows.empty();
}